

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverLines.cpp
# Opt level: O0

void fillRow1<float>(Matrix<float,_6,_1,_0,_6,_1> *l01,Matrix<float,_6,_1,_0,_6,_1> *l02,
                    Matrix<float,_6,_1,_0,_6,_1> *l11,Matrix<float,_6,_1,_0,_6,_1> *l12,
                    vector<float,_std::allocator<float>_> *c0,
                    vector<float,_std::allocator<float>_> *c1,
                    vector<float,_std::allocator<float>_> *c2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  vector<float,_std::allocator<float>_> *pvVar108;
  CoeffReturnType pfVar109;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  vector<float,_std::allocator<float>_> *local_38;
  vector<float,_std::allocator<float>_> *c1_local;
  vector<float,_std::allocator<float>_> *c0_local;
  Matrix<float,_6,_1,_0,_6,_1> *l12_local;
  Matrix<float,_6,_1,_0,_6,_1> *l11_local;
  Matrix<float,_6,_1,_0,_6,_1> *l02_local;
  Matrix<float,_6,_1,_0,_6,_1> *l01_local;
  
  local_38 = c1;
  c1_local = c0;
  c0_local = (vector<float,_std::allocator<float>_> *)l12;
  l12_local = l11;
  l11_local = l02;
  l02_local = l01;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  local_3c = -(fVar16 * fVar17) * *pfVar109 +
             fVar13 * fVar14 * fVar15 +
             -(fVar10 * fVar11) * fVar12 +
             fVar7 * fVar8 * fVar9 + -fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(c0,&local_3c);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  local_40 = fVar10 * 2.0 * fVar11 * *pfVar109 +
             -(fVar7 * 2.0 * fVar8) * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_40);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  local_44 = fVar16 * fVar17 * *pfVar109 +
             -(fVar13 * fVar14) * fVar15 +
             fVar10 * fVar11 * fVar12 +
             -(fVar7 * fVar8) * fVar9 + -fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_44);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  local_48 = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_48);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  local_4c = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * -2.0 * fVar2 * fVar3 + fVar4 * 2.0 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_4c);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  local_50 = fVar16 * fVar17 * *pfVar109 +
             -(fVar13 * fVar14) * fVar15 +
             -(fVar10 * fVar11) * fVar12 +
             fVar7 * fVar8 * fVar9 + fVar1 * fVar2 * fVar3 + -(fVar4 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_50);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  local_54 = fVar10 * 2.0 * fVar11 * *pfVar109 +
             -(fVar7 * 2.0 * fVar8) * fVar9 +
             fVar1 * -2.0 * fVar2 * fVar3 + fVar4 * 2.0 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_54);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  local_58 = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * -2.0 * fVar2 * fVar3 + fVar4 * 2.0 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_58);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  local_5c = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_5c);
  pvVar108 = c1_local;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  local_60 = -(fVar16 * fVar17) * *pfVar109 +
             fVar13 * fVar14 * fVar15 +
             fVar10 * fVar11 * fVar12 +
             -(fVar7 * fVar8) * fVar9 + fVar1 * fVar2 * fVar3 + -(fVar4 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_60);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  local_64 = -(fVar16 * fVar17) * *pfVar109 +
             fVar13 * fVar14 * fVar15 +
             -(fVar10 * fVar11) * fVar12 +
             -(fVar7 * fVar8) * fVar9 + fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_64);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  local_68 = fVar10 * 2.0 * fVar11 * *pfVar109 +
             -(fVar7 * 2.0 * fVar8) * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_68);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  local_6c = fVar16 * fVar17 * *pfVar109 +
             fVar13 * fVar14 * fVar15 +
             fVar10 * fVar11 * fVar12 +
             -(fVar7 * fVar8) * fVar9 + -fVar1 * fVar2 * fVar3 + -(fVar4 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_6c);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  local_70 = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_70);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  local_74 = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * -2.0 * fVar2 * fVar3 + fVar4 * 2.0 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_74);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  local_78 = -(fVar16 * fVar17) * *pfVar109 +
             -(fVar13 * fVar14) * fVar15 +
             fVar10 * fVar11 * fVar12 +
             fVar7 * fVar8 * fVar9 + fVar1 * fVar2 * fVar3 + -(fVar4 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_78);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  local_7c = -(fVar10 * 2.0 * fVar11) * *pfVar109 +
             -(fVar7 * 2.0 * fVar8) * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + fVar4 * 2.0 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_7c);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  local_80 = fVar10 * 2.0 * fVar11 * *pfVar109 +
             -(fVar7 * 2.0 * fVar8) * fVar9 +
             fVar1 * 2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_80);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  local_84 = fVar10 * 2.0 * fVar11 * *pfVar109 +
             fVar7 * 2.0 * fVar8 * fVar9 +
             fVar1 * -2.0 * fVar2 * fVar3 + -(fVar4 * 2.0 * fVar5 * fVar6);
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_84);
  pvVar108 = local_38;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  local_88 = fVar16 * fVar17 * *pfVar109 +
             -(fVar13 * fVar14) * fVar15 +
             -(fVar10 * fVar11) * fVar12 +
             fVar7 * fVar8 * fVar9 + -fVar1 * fVar2 * fVar3 + fVar4 * fVar5 * fVar6;
  std::vector<float,_std::allocator<float>_>::push_back(pvVar108,&local_88);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar72 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar73 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar74 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar75 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar76 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar77 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar78 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar79 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar80 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar81 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar82 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar83 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar84 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar85 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar86 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar87 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar88 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar89 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar90 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar91 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar92 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar93 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar94 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar95 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar96 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar97 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar98 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar99 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar100 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar101 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar102 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar103 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  fVar104 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar105 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  fVar106 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar107 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  local_8c = fVar107 * *pfVar109 +
             -fVar105 * fVar106 +
             -fVar103 * fVar104 +
             fVar101 * fVar102 +
             -fVar99 * fVar100 +
             -fVar97 * fVar98 +
             -(fVar93 * fVar94 * fVar95) * fVar96 +
             fVar89 * fVar90 * fVar91 * fVar92 +
             -(fVar85 * fVar86 * fVar87) * fVar88 +
             fVar81 * fVar82 * fVar83 * fVar84 +
             -(fVar77 * fVar78 * fVar79) * fVar80 +
             fVar73 * fVar74 * fVar75 * fVar76 +
             -(fVar69 * fVar70 * fVar71) * fVar72 +
             fVar65 * fVar66 * fVar67 * fVar68 +
             -(fVar61 * fVar62 * fVar63) * fVar64 +
             fVar57 * fVar58 * fVar59 * fVar60 +
             -(fVar53 * fVar54 * fVar55) * fVar56 +
             fVar49 * fVar50 * fVar51 * fVar52 +
             fVar45 * fVar46 * fVar47 * fVar48 +
             -(fVar41 * fVar42 * fVar43) * fVar44 +
             -(fVar37 * fVar38 * fVar39) * fVar40 +
             fVar33 * fVar34 * fVar35 * fVar36 +
             -(fVar29 * fVar30 * fVar31) * fVar32 +
             fVar25 * fVar26 * fVar27 * fVar28 +
             -(fVar21 * fVar22 * fVar23) * fVar24 +
             fVar17 * fVar18 * fVar19 * fVar20 +
             -(fVar13 * fVar14 * fVar15) * fVar16 +
             fVar9 * fVar10 * fVar11 * fVar12 +
             -fVar1 * fVar2 * fVar3 * fVar4 + fVar5 * fVar6 * fVar7 * fVar8;
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_8c);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  local_90 = fVar71 * 2.0 * *pfVar109 +
             fVar69 * 2.0 * fVar70 +
             fVar67 * 2.0 * fVar68 +
             fVar65 * 2.0 * fVar66 +
             fVar61 * 2.0 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * 2.0 * fVar58 * fVar59) * fVar60 +
             fVar53 * 2.0 * fVar54 * fVar55 * fVar56 +
             -(fVar49 * 2.0 * fVar50 * fVar51) * fVar52 +
             -(fVar45 * 2.0 * fVar46 * fVar47) * fVar48 +
             fVar41 * 2.0 * fVar42 * fVar43 * fVar44 +
             -(fVar37 * 2.0 * fVar38 * fVar39) * fVar40 +
             fVar33 * 2.0 * fVar34 * fVar35 * fVar36 +
             -(fVar29 * 2.0 * fVar30 * fVar31) * fVar32 +
             fVar25 * 2.0 * fVar26 * fVar27 * fVar28 +
             -(fVar21 * 2.0 * fVar22 * fVar23) * fVar24 +
             fVar17 * 2.0 * fVar18 * fVar19 * fVar20 +
             -(fVar13 * 2.0 * fVar14 * fVar15) * fVar16 +
             fVar9 * 2.0 * fVar10 * fVar11 * fVar12 +
             fVar1 * 2.0 * fVar2 * fVar3 * fVar4 + -(fVar5 * 2.0 * fVar6 * fVar7 * fVar8);
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_90);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar72 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar73 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar74 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar75 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar76 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar77 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar78 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar79 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar80 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar81 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar82 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar83 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar84 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar85 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar86 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar87 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar88 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar89 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar90 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar91 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar92 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar93 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar94 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar95 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar96 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar97 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar98 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar99 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar100 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar101 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar102 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar103 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  fVar104 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar105 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  fVar106 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar107 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  local_94 = -fVar107 * *pfVar109 +
             fVar105 * fVar106 +
             -fVar103 * fVar104 +
             -fVar101 * fVar102 +
             fVar99 * fVar100 +
             -fVar97 * fVar98 +
             fVar93 * fVar94 * fVar95 * fVar96 +
             -(fVar89 * fVar90 * fVar91) * fVar92 +
             fVar85 * fVar86 * fVar87 * fVar88 +
             -(fVar81 * fVar82 * fVar83) * fVar84 +
             fVar77 * fVar78 * fVar79 * fVar80 +
             -(fVar73 * fVar74 * fVar75) * fVar76 +
             -(fVar69 * fVar70 * fVar71) * fVar72 +
             fVar65 * fVar66 * fVar67 * fVar68 +
             fVar61 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * fVar58 * fVar59) * fVar60 +
             fVar53 * fVar54 * fVar55 * fVar56 +
             -(fVar49 * fVar50 * fVar51) * fVar52 +
             -(fVar45 * fVar46 * fVar47) * fVar48 +
             fVar41 * fVar42 * fVar43 * fVar44 +
             -(fVar37 * fVar38 * fVar39) * fVar40 +
             fVar33 * fVar34 * fVar35 * fVar36 +
             -(fVar29 * fVar30 * fVar31) * fVar32 +
             fVar25 * fVar26 * fVar27 * fVar28 +
             fVar21 * fVar22 * fVar23 * fVar24 +
             -(fVar17 * fVar18 * fVar19) * fVar20 +
             -(fVar13 * fVar14 * fVar15) * fVar16 +
             fVar9 * fVar10 * fVar11 * fVar12 +
             fVar1 * fVar2 * fVar3 * fVar4 + -(fVar5 * fVar6 * fVar7 * fVar8);
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_94);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  local_98 = fVar71 * 2.0 * *pfVar109 +
             fVar69 * 2.0 * fVar70 +
             fVar67 * 2.0 * fVar68 +
             fVar65 * 2.0 * fVar66 +
             fVar61 * 2.0 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * 2.0 * fVar58 * fVar59) * fVar60 +
             fVar53 * 2.0 * fVar54 * fVar55 * fVar56 +
             -(fVar49 * 2.0 * fVar50 * fVar51) * fVar52 +
             fVar45 * 2.0 * fVar46 * fVar47 * fVar48 +
             -(fVar41 * 2.0 * fVar42 * fVar43) * fVar44 +
             fVar37 * 2.0 * fVar38 * fVar39 * fVar40 +
             -(fVar33 * 2.0 * fVar34 * fVar35) * fVar36 +
             -(fVar29 * 2.0 * fVar30 * fVar31) * fVar32 +
             fVar25 * 2.0 * fVar26 * fVar27 * fVar28 +
             -(fVar21 * 2.0 * fVar22 * fVar23) * fVar24 +
             fVar17 * 2.0 * fVar18 * fVar19 * fVar20 +
             -(fVar13 * 2.0 * fVar14 * fVar15) * fVar16 +
             fVar9 * 2.0 * fVar10 * fVar11 * fVar12 +
             fVar1 * 2.0 * fVar2 * fVar3 * fVar4 + -(fVar5 * 2.0 * fVar6 * fVar7 * fVar8);
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_98);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  local_9c = fVar71 * 2.0 * *pfVar109 +
             fVar69 * 2.0 * fVar70 +
             fVar67 * 2.0 * fVar68 +
             fVar65 * 2.0 * fVar66 +
             fVar61 * 2.0 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * 2.0 * fVar58 * fVar59) * fVar60 +
             fVar53 * 2.0 * fVar54 * fVar55 * fVar56 +
             -(fVar49 * 2.0 * fVar50 * fVar51) * fVar52 +
             fVar45 * 2.0 * fVar46 * fVar47 * fVar48 +
             -(fVar41 * 2.0 * fVar42 * fVar43) * fVar44 +
             fVar37 * 2.0 * fVar38 * fVar39 * fVar40 +
             -(fVar33 * 2.0 * fVar34 * fVar35) * fVar36 +
             fVar29 * 2.0 * fVar30 * fVar31 * fVar32 +
             -(fVar25 * 2.0 * fVar26 * fVar27) * fVar28 +
             fVar21 * 2.0 * fVar22 * fVar23 * fVar24 +
             -(fVar17 * 2.0 * fVar18 * fVar19) * fVar20 +
             -(fVar13 * 2.0 * fVar14 * fVar15) * fVar16 +
             fVar9 * 2.0 * fVar10 * fVar11 * fVar12 +
             fVar1 * 2.0 * fVar2 * fVar3 * fVar4 + -(fVar5 * 2.0 * fVar6 * fVar7 * fVar8);
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_9c);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar72 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar73 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar74 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar75 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar76 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar77 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar78 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar79 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar80 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar81 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar82 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar83 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar84 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar85 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar86 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar87 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar88 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar89 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar90 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar91 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar92 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar93 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar94 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar95 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar96 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar97 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar98 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar99 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar100 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar101 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar102 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar103 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  fVar104 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar105 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  fVar106 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar107 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  local_a0 = -fVar107 * *pfVar109 +
             -fVar105 * fVar106 +
             fVar103 * fVar104 +
             -fVar101 * fVar102 +
             -fVar99 * fVar100 +
             fVar97 * fVar98 +
             fVar93 * fVar94 * fVar95 * fVar96 +
             -(fVar89 * fVar90 * fVar91) * fVar92 +
             -(fVar85 * fVar86 * fVar87) * fVar88 +
             fVar81 * fVar82 * fVar83 * fVar84 +
             fVar77 * fVar78 * fVar79 * fVar80 +
             -(fVar73 * fVar74 * fVar75) * fVar76 +
             fVar69 * fVar70 * fVar71 * fVar72 +
             -(fVar65 * fVar66 * fVar67) * fVar68 +
             -(fVar61 * fVar62 * fVar63) * fVar64 +
             fVar57 * fVar58 * fVar59 * fVar60 +
             fVar53 * fVar54 * fVar55 * fVar56 +
             -(fVar49 * fVar50 * fVar51) * fVar52 +
             fVar45 * fVar46 * fVar47 * fVar48 +
             -(fVar41 * fVar42 * fVar43) * fVar44 +
             fVar37 * fVar38 * fVar39 * fVar40 +
             -(fVar33 * fVar34 * fVar35) * fVar36 +
             fVar29 * fVar30 * fVar31 * fVar32 +
             -(fVar25 * fVar26 * fVar27) * fVar28 +
             fVar21 * fVar22 * fVar23 * fVar24 +
             -(fVar17 * fVar18 * fVar19) * fVar20 +
             fVar13 * fVar14 * fVar15 * fVar16 +
             -(fVar9 * fVar10 * fVar11) * fVar12 +
             -fVar1 * fVar2 * fVar3 * fVar4 + fVar5 * fVar6 * fVar7 * fVar8;
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_a0);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  local_a4 = -(fVar71 * 2.0) * *pfVar109 +
             fVar69 * 2.0 * fVar70 +
             -(fVar67 * 2.0) * fVar68 +
             fVar65 * 2.0 * fVar66 +
             fVar61 * 2.0 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * 2.0 * fVar58 * fVar59) * fVar60 +
             -(fVar53 * 2.0 * fVar54 * fVar55) * fVar56 +
             fVar49 * 2.0 * fVar50 * fVar51 * fVar52 +
             -(fVar45 * 2.0 * fVar46 * fVar47) * fVar48 +
             fVar41 * 2.0 * fVar42 * fVar43 * fVar44 +
             -(fVar37 * 2.0 * fVar38 * fVar39) * fVar40 +
             fVar33 * 2.0 * fVar34 * fVar35 * fVar36 +
             fVar29 * 2.0 * fVar30 * fVar31 * fVar32 +
             -(fVar25 * 2.0 * fVar26 * fVar27) * fVar28 +
             fVar21 * 2.0 * fVar22 * fVar23 * fVar24 +
             -(fVar17 * 2.0 * fVar18 * fVar19) * fVar20 +
             -(fVar13 * 2.0 * fVar14 * fVar15) * fVar16 +
             fVar9 * 2.0 * fVar10 * fVar11 * fVar12 +
             fVar1 * -2.0 * fVar2 * fVar3 * fVar4 + fVar5 * 2.0 * fVar6 * fVar7 * fVar8;
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_a4);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  local_a8 = fVar71 * 2.0 * *pfVar109 +
             -(fVar69 * 2.0) * fVar70 +
             fVar67 * 2.0 * fVar68 +
             -(fVar65 * 2.0) * fVar66 +
             fVar61 * 2.0 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * 2.0 * fVar58 * fVar59) * fVar60 +
             -(fVar53 * 2.0 * fVar54 * fVar55) * fVar56 +
             fVar49 * 2.0 * fVar50 * fVar51 * fVar52 +
             fVar45 * 2.0 * fVar46 * fVar47 * fVar48 +
             -(fVar41 * 2.0 * fVar42 * fVar43) * fVar44 +
             -(fVar37 * 2.0 * fVar38 * fVar39) * fVar40 +
             fVar33 * 2.0 * fVar34 * fVar35 * fVar36 +
             -(fVar29 * 2.0 * fVar30 * fVar31) * fVar32 +
             fVar25 * 2.0 * fVar26 * fVar27 * fVar28 +
             fVar21 * 2.0 * fVar22 * fVar23 * fVar24 +
             -(fVar17 * 2.0 * fVar18 * fVar19) * fVar20 +
             fVar13 * 2.0 * fVar14 * fVar15 * fVar16 +
             -(fVar9 * 2.0 * fVar10 * fVar11) * fVar12 +
             fVar1 * 2.0 * fVar2 * fVar3 * fVar4 + -(fVar5 * 2.0 * fVar6 * fVar7 * fVar8);
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_a8);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  local_ac = -(fVar71 * 2.0) * *pfVar109 +
             fVar69 * 2.0 * fVar70 +
             -(fVar67 * 2.0) * fVar68 +
             fVar65 * 2.0 * fVar66 +
             -(fVar61 * 2.0 * fVar62 * fVar63) * fVar64 +
             fVar57 * 2.0 * fVar58 * fVar59 * fVar60 +
             fVar53 * 2.0 * fVar54 * fVar55 * fVar56 +
             -(fVar49 * 2.0 * fVar50 * fVar51) * fVar52 +
             fVar45 * 2.0 * fVar46 * fVar47 * fVar48 +
             -(fVar41 * 2.0 * fVar42 * fVar43) * fVar44 +
             -(fVar37 * 2.0 * fVar38 * fVar39) * fVar40 +
             fVar33 * 2.0 * fVar34 * fVar35 * fVar36 +
             fVar29 * 2.0 * fVar30 * fVar31 * fVar32 +
             -(fVar25 * 2.0 * fVar26 * fVar27) * fVar28 +
             -(fVar21 * 2.0 * fVar22 * fVar23) * fVar24 +
             fVar17 * 2.0 * fVar18 * fVar19 * fVar20 +
             -(fVar13 * 2.0 * fVar14 * fVar15) * fVar16 +
             fVar9 * 2.0 * fVar10 * fVar11 * fVar12 +
             fVar1 * -2.0 * fVar2 * fVar3 * fVar4 + fVar5 * 2.0 * fVar6 * fVar7 * fVar8;
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_ac);
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar1 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar2 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar3 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar4 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar5 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar6 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar7 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar8 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar9 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar10 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar11 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar12 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar13 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar14 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar15 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar16 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar17 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar18 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar19 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar20 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar21 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar22 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar23 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar24 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar25 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar26 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar27 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar28 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar29 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar30 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar31 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar32 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar33 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar34 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar35 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar36 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar37 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar38 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar39 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar40 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar41 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar42 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar43 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar44 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar45 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar46 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar47 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar48 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar49 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar50 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar51 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar52 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar53 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar54 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar55 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar56 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar57 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar58 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar59 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar60 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar61 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar62 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar63 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar64 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar65 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar66 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,5);
  fVar67 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar68 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar69 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar70 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar71 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,2);
  fVar72 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar73 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar74 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,5);
  fVar75 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar76 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar77 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar78 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar79 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,2);
  fVar80 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar81 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar82 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,4);
  fVar83 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,0);
  fVar84 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar85 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar86 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,3);
  fVar87 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l11_local,1);
  fVar88 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar89 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar90 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,4);
  fVar91 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,0);
  fVar92 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar93 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar94 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,3);
  fVar95 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l02_local,1);
  fVar96 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,5);
  fVar97 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,2);
  fVar98 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,4);
  fVar99 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,1);
  fVar100 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,3);
  fVar101 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,0);
  fVar102 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,2);
  fVar103 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,5);
  fVar104 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,1);
  fVar105 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,4);
  fVar106 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)c0_local,0);
  fVar107 = *pfVar109;
  pfVar109 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0> *)l12_local,3);
  local_b0 = fVar107 * *pfVar109 +
             fVar105 * fVar106 +
             fVar103 * fVar104 +
             fVar101 * fVar102 +
             fVar99 * fVar100 +
             fVar97 * fVar98 +
             -(fVar93 * fVar94 * fVar95) * fVar96 +
             fVar89 * fVar90 * fVar91 * fVar92 +
             fVar85 * fVar86 * fVar87 * fVar88 +
             -(fVar81 * fVar82 * fVar83) * fVar84 +
             -(fVar77 * fVar78 * fVar79) * fVar80 +
             fVar73 * fVar74 * fVar75 * fVar76 +
             fVar69 * fVar70 * fVar71 * fVar72 +
             -(fVar65 * fVar66 * fVar67) * fVar68 +
             fVar61 * fVar62 * fVar63 * fVar64 +
             -(fVar57 * fVar58 * fVar59) * fVar60 +
             -(fVar53 * fVar54 * fVar55) * fVar56 +
             fVar49 * fVar50 * fVar51 * fVar52 +
             -(fVar45 * fVar46 * fVar47) * fVar48 +
             fVar41 * fVar42 * fVar43 * fVar44 +
             fVar37 * fVar38 * fVar39 * fVar40 +
             -(fVar33 * fVar34 * fVar35) * fVar36 +
             fVar29 * fVar30 * fVar31 * fVar32 +
             -(fVar25 * fVar26 * fVar27) * fVar28 +
             -(fVar21 * fVar22 * fVar23) * fVar24 +
             fVar17 * fVar18 * fVar19 * fVar20 +
             fVar13 * fVar14 * fVar15 * fVar16 +
             -(fVar9 * fVar10 * fVar11) * fVar12 +
             fVar1 * fVar2 * fVar3 * fVar4 + -(fVar5 * fVar6 * fVar7 * fVar8);
  std::vector<float,_std::allocator<float>_>::push_back(c2,&local_b0);
  return;
}

Assistant:

void fillRow1(const Eigen::Matrix<floatPrec,6,1> & l01,
    const Eigen::Matrix<floatPrec,6,1> & l02,
    const Eigen::Matrix<floatPrec,6,1> & l11,
    const Eigen::Matrix<floatPrec,6,1> & l12,
    std::vector<floatPrec> & c0,
    std::vector<floatPrec> & c1,
    std::vector<floatPrec> & c2 )
{
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]-2*l12[0]*l11[2]*l01[0]+2*l12[0]*l11[0]*l01[2]);
  c0.push_back(-l12[2]*l11[1]*l01[0]+l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(2*l12[2]*l11[2]*l01[1]-2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]+2*l12[1]*l11[1]*l01[0]-2*l12[1]*l11[0]*l01[1]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]+l12[1]*l11[2]*l01[0]-l12[1]*l11[0]*l01[2]-l12[0]*l11[2]*l01[1]+l12[0]*l11[1]*l01[2]);
  c0.push_back(-2*l12[2]*l11[2]*l01[0]+2*l12[2]*l11[0]*l01[2]-2*l12[1]*l11[1]*l01[0]+2*l12[1]*l11[0]*l01[1]);
  c0.push_back(-2*l12[2]*l11[2]*l01[1]+2*l12[2]*l11[1]*l01[2]+2*l12[0]*l11[1]*l01[0]-2*l12[0]*l11[0]*l01[1]);
  c0.push_back(2*l12[1]*l11[2]*l01[1]-2*l12[1]*l11[1]*l01[2]+2*l12[0]*l11[2]*l01[0]-2*l12[0]*l11[0]*l01[2]);
  c0.push_back(l12[2]*l11[1]*l01[0]-l12[2]*l11[0]*l01[1]-l12[1]*l11[2]*l01[0]+l12[1]*l11[0]*l01[2]+l12[0]*l11[2]*l01[1]-l12[0]*l11[1]*l01[2]);
  c1.push_back(l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]-2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]-l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]+l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]+2*l12[1]*l11[0]*l02[0]-2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]+2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(l12[2]*l11[1]*l02[0]-l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]+l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]-l12[0]*l11[1]*l02[2]);
  c1.push_back(2*l12[2]*l11[2]*l02[0]+2*l12[1]*l11[1]*l02[0]-2*l12[0]*l11[2]*l02[2]-2*l12[0]*l11[1]*l02[1]);
  c1.push_back(2*l12[2]*l11[2]*l02[1]-2*l12[1]*l11[2]*l02[2]-2*l12[1]*l11[0]*l02[0]+2*l12[0]*l11[0]*l02[1]);
  c1.push_back(-2*l12[2]*l11[1]*l02[1]-2*l12[2]*l11[0]*l02[0]+2*l12[1]*l11[1]*l02[2]+2*l12[0]*l11[0]*l02[2]);
  c1.push_back(-l12[2]*l11[1]*l02[0]+l12[2]*l11[0]*l02[1]+l12[1]*l11[2]*l02[0]-l12[1]*l11[0]*l02[2]-l12[0]*l11[2]*l02[1]+l12[0]*l11[1]*l02[2]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]-l12[4]*l11[1]+l12[3]*l11[0]-l12[2]*l11[5]-l12[1]*l11[4]+l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[1]*l02[5]*l02[0]-2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]+2*l12[1]*l11[1]*l02[4]*l02[0]-2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]+2*l12[0]*l11[2]*l01[5]*l01[1]-2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]-2*l12[0]*l11[0]*l01[4]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]+2*l12[3]*l11[1]+2*l12[1]*l11[3]+2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]+l12[2]*l11[1]*l01[5]*l01[1]-l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]+l12[2]*l11[0]*l01[5]*l01[0]-l12[2]*l11[0]*l01[3]*l01[2]+l12[1]*l11[2]*l02[5]*l02[1]-l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]+l12[0]*l11[2]*l02[5]*l02[0]-l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]-l12[5]*l11[2]+l12[4]*l11[1]-l12[3]*l11[0]-l12[2]*l11[5]+l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[0]-2*l12[2]*l11[2]*l01[3]*l01[2]+2*l12[2]*l11[1]*l01[4]*l01[0]-2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]-2*l12[1]*l11[0]*l02[5]*l02[1]+2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[5]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]+2*l12[5]*l11[0]+2*l12[3]*l11[2]+2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[1]-2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]-2*l12[1]*l11[1]*l01[5]*l01[1]+2*l12[1]*l11[1]*l01[4]*l01[2]-2*l12[1]*l11[0]*l01[5]*l01[0]+2*l12[1]*l11[0]*l01[3]*l01[2]-2*l12[0]*l11[2]*l02[4]*l02[0]+2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]+2*l12[4]*l11[2]+2*l12[2]*l11[4]+2*l12[1]*l11[5]);
  c2.push_back(-l12[2]*l11[1]*l02[5]*l02[1]+l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]-l12[2]*l11[0]*l02[5]*l02[0]+l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]-l12[1]*l11[2]*l01[5]*l01[1]+l12[1]*l11[2]*l01[4]*l01[2]-l12[1]*l11[0]*l02[4]*l02[0]+l12[1]*l11[0]*l02[3]*l02[1]+l12[1]*l11[0]*l01[4]*l01[0]-l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]-l12[0]*l11[2]*l01[5]*l01[0]+l12[0]*l11[2]*l01[3]*l01[2]+l12[0]*l11[1]*l02[4]*l02[0]-l12[0]*l11[1]*l02[3]*l02[1]-l12[0]*l11[1]*l01[4]*l01[0]+l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]-l12[4]*l11[1]-l12[3]*l11[0]+l12[2]*l11[5]-l12[1]*l11[4]-l12[0]*l11[3]);
  c2.push_back(-2*l12[2]*l11[2]*l02[5]*l02[1]+2*l12[2]*l11[2]*l02[4]*l02[2]+2*l12[2]*l11[2]*l01[5]*l01[1]-2*l12[2]*l11[2]*l01[4]*l01[2]-2*l12[2]*l11[0]*l01[4]*l01[0]+2*l12[2]*l11[0]*l01[3]*l01[1]-2*l12[1]*l11[1]*l02[5]*l02[1]+2*l12[1]*l11[1]*l02[4]*l02[2]+2*l12[1]*l11[1]*l01[5]*l01[1]-2*l12[1]*l11[1]*l01[4]*l01[2]+2*l12[1]*l11[0]*l01[5]*l01[0]-2*l12[1]*l11[0]*l01[3]*l01[2]+2*l12[0]*l11[2]*l02[4]*l02[0]-2*l12[0]*l11[2]*l02[3]*l02[1]-2*l12[0]*l11[1]*l02[5]*l02[0]+2*l12[0]*l11[1]*l02[3]*l02[2]+2*l12[5]*l11[1]-2*l12[4]*l11[2]+2*l12[2]*l11[4]-2*l12[1]*l11[5]);
  c2.push_back(2*l12[2]*l11[2]*l02[5]*l02[0]-2*l12[2]*l11[2]*l02[3]*l02[2]-2*l12[2]*l11[2]*l01[5]*l01[0]+2*l12[2]*l11[2]*l01[3]*l01[2]-2*l12[2]*l11[1]*l01[4]*l01[0]+2*l12[2]*l11[1]*l01[3]*l01[1]+2*l12[1]*l11[2]*l02[4]*l02[0]-2*l12[1]*l11[2]*l02[3]*l02[1]+2*l12[1]*l11[0]*l02[5]*l02[1]-2*l12[1]*l11[0]*l02[4]*l02[2]-2*l12[0]*l11[1]*l01[5]*l01[1]+2*l12[0]*l11[1]*l01[4]*l01[2]+2*l12[0]*l11[0]*l02[5]*l02[0]-2*l12[0]*l11[0]*l02[3]*l02[2]-2*l12[0]*l11[0]*l01[5]*l01[0]+2*l12[0]*l11[0]*l01[3]*l01[2]-2*l12[5]*l11[0]+2*l12[3]*l11[2]-2*l12[2]*l11[3]+2*l12[0]*l11[5]);
  c2.push_back(-2*l12[2]*l11[1]*l02[5]*l02[0]+2*l12[2]*l11[1]*l02[3]*l02[2]+2*l12[2]*l11[0]*l02[5]*l02[1]-2*l12[2]*l11[0]*l02[4]*l02[2]+2*l12[1]*l11[2]*l01[5]*l01[0]-2*l12[1]*l11[2]*l01[3]*l01[2]-2*l12[1]*l11[1]*l02[4]*l02[0]+2*l12[1]*l11[1]*l02[3]*l02[1]+2*l12[1]*l11[1]*l01[4]*l01[0]-2*l12[1]*l11[1]*l01[3]*l01[1]-2*l12[0]*l11[2]*l01[5]*l01[1]+2*l12[0]*l11[2]*l01[4]*l01[2]-2*l12[0]*l11[0]*l02[4]*l02[0]+2*l12[0]*l11[0]*l02[3]*l02[1]+2*l12[0]*l11[0]*l01[4]*l01[0]-2*l12[0]*l11[0]*l01[3]*l01[1]+2*l12[4]*l11[0]-2*l12[3]*l11[1]+2*l12[1]*l11[3]-2*l12[0]*l11[4]);
  c2.push_back(l12[2]*l11[1]*l02[5]*l02[1]-l12[2]*l11[1]*l02[4]*l02[2]-l12[2]*l11[1]*l01[5]*l01[1]+l12[2]*l11[1]*l01[4]*l01[2]+l12[2]*l11[0]*l02[5]*l02[0]-l12[2]*l11[0]*l02[3]*l02[2]-l12[2]*l11[0]*l01[5]*l01[0]+l12[2]*l11[0]*l01[3]*l01[2]-l12[1]*l11[2]*l02[5]*l02[1]+l12[1]*l11[2]*l02[4]*l02[2]+l12[1]*l11[2]*l01[5]*l01[1]-l12[1]*l11[2]*l01[4]*l01[2]+l12[1]*l11[0]*l02[4]*l02[0]-l12[1]*l11[0]*l02[3]*l02[1]-l12[1]*l11[0]*l01[4]*l01[0]+l12[1]*l11[0]*l01[3]*l01[1]-l12[0]*l11[2]*l02[5]*l02[0]+l12[0]*l11[2]*l02[3]*l02[2]+l12[0]*l11[2]*l01[5]*l01[0]-l12[0]*l11[2]*l01[3]*l01[2]-l12[0]*l11[1]*l02[4]*l02[0]+l12[0]*l11[1]*l02[3]*l02[1]+l12[0]*l11[1]*l01[4]*l01[0]-l12[0]*l11[1]*l01[3]*l01[1]+l12[5]*l11[2]+l12[4]*l11[1]+l12[3]*l11[0]+l12[2]*l11[5]+l12[1]*l11[4]+l12[0]*l11[3]);
}